

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

bool __thiscall
icu_63::number::impl::DecimalQuantity::fitsInLong(DecimalQuantity *this,bool ignoreFraction)

{
  byte bVar1;
  uint uVar2;
  int8_t *piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  bool bVar11;
  
  uVar2 = this->precision;
  uVar7 = (ulong)uVar2;
  bVar4 = true;
  if (uVar7 == 0) {
    return true;
  }
  iVar6 = this->scale;
  if (-1 < iVar6 || ignoreFraction) {
    iVar5 = uVar2 + iVar6 + -1;
    if (iVar5 < 0x12) {
      return true;
    }
    if (iVar5 == 0x12) {
      bVar11 = 0 < (int)uVar2;
      if (0 < (int)uVar2) {
        piVar3 = (this->fBCD).bcdBytes.ptr;
        uVar8 = 0x12 - iVar6;
        iVar6 = iVar6 * -4 + 0x48;
        uVar9 = 0;
        do {
          if (this->usingBytes == false) {
            if (0xf < uVar8) goto LAB_0022245a;
            bVar10 = (byte)((ulong)piVar3 >> ((byte)iVar6 & 0x3f)) & 0xf;
          }
          else if (uVar8 < uVar2) {
            bVar10 = piVar3[uVar8];
          }
          else {
LAB_0022245a:
            bVar10 = 0;
          }
          bVar1 = "\t\x02\x02\x03\x03\a\x02"[uVar9];
          bVar4 = (bool)(bVar4 & (char)bVar10 <= (char)bVar1 | (char)bVar10 < (char)bVar1);
          if (bVar10 != bVar1) break;
          uVar9 = uVar9 + 1;
          bVar11 = uVar9 < uVar7;
          uVar8 = uVar8 - 1;
          iVar6 = iVar6 + -4;
        } while (uVar7 != uVar9);
      }
      if (bVar11) {
        return bVar4;
      }
      return (bool)(this->flags & 1);
    }
  }
  return false;
}

Assistant:

bool DecimalQuantity::isZero() const {
    return precision == 0;
}